

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem.cc
# Opt level: O0

size_t OPENSSL_strlcat(char *dst,char *src,size_t dst_size)

{
  size_t sVar1;
  bool bVar2;
  long local_28;
  size_t l;
  size_t dst_size_local;
  char *src_local;
  char *dst_local;
  
  local_28 = 0;
  l = dst_size;
  src_local = dst;
  while( true ) {
    bVar2 = false;
    if (l != 0) {
      bVar2 = *src_local != '\0';
    }
    if (!bVar2) break;
    local_28 = local_28 + 1;
    l = l - 1;
    src_local = src_local + 1;
  }
  sVar1 = OPENSSL_strlcpy(src_local,src,l);
  return local_28 + sVar1;
}

Assistant:

size_t OPENSSL_strlcat(char *dst, const char *src, size_t dst_size) {
  size_t l = 0;
  for (; dst_size > 0 && *dst; dst_size--, dst++) {
    l++;
  }
  return l + OPENSSL_strlcpy(dst, src, dst_size);
}